

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O1

void __thiscall
ANN::set_labels(ANN *this,LayerType label_type,
               initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *labels)

{
  ulong uVar1;
  
  if (label_type == OutputLayer) {
    uVar1 = (ulong)((int)((ulong)((long)(this->m_layers).
                                        super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)(this->m_layers).
                                       super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 3) * -0x45d1745d - 1);
  }
  else {
    uVar1 = 0;
  }
  Layer::set_labels((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar1,labels);
  return;
}

Assistant:

void ANN::set_labels(LayerType label_type, const std::initializer_list<std::string>& labels){
    uint index;
    switch (label_type)
    {
    case InputLayer:
        index=0;
        break;
    case OutputLayer:
        index=m_layers.size()-1;
        break;
    default: break;
    }
    m_layers[index].set_labels(labels);
}